

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O3

int pull_by_size(char *input_file,int min,int max,int length,int convert,int just_count)

{
  kstring_t *str;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  gzFile pgVar6;
  kseq_t *seq;
  kstream_t *pkVar7;
  uchar *puVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  size_t __size;
  uint uVar15;
  uint uStackY_84;
  ulong uStackY_80;
  
  pgVar6 = (gzFile)gzopen();
  if (pgVar6 == (gzFile)0x0) {
    pull_by_size_cold_2();
    pkVar7 = (kstream_t *)((kstring_t *)((long)input_file + 0x60))->m;
    uStackY_80 = (ulong)(uint)length;
    if ((int)((kstring_t *)((long)input_file + 0x60))->l == 0) {
      iVar4 = pkVar7->begin;
      iVar5 = pkVar7->end;
      iVar14 = -1;
      do {
        if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
          return -1;
        }
        puVar8 = pkVar7->buf;
        if (iVar5 <= iVar4) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) goto LAB_00105512;
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        bVar1 = puVar8[lVar12];
        uStackY_84 = (uint)bVar1;
      } while ((uStackY_84 != 0x40) && (bVar1 != 0x3e));
      *(uint *)&((kstring_t *)((long)input_file + 0x60))->l = (uint)bVar1;
    }
    ((kstring_t *)((long)input_file + 0x48))->l = 0;
    ((kstring_t *)((long)input_file + 0x30))->l = 0;
    ((kstring_t *)((long)input_file + 0x18))->l = 0;
    iVar4 = ks_getuntil2(pkVar7,0,(kstring_t *)input_file,(int *)&uStackY_84,0);
    if (iVar4 < 0) {
      return -1;
    }
    if (uStackY_84 != 10) {
      ks_getuntil2(pkVar7,2,(kstring_t *)((long)input_file + 0x18),(int *)0x0,0);
    }
    if (((kstring_t *)((long)input_file + 0x30))->s == (char *)0x0) {
      ((kstring_t *)((long)input_file + 0x30))->m = 0x100;
      pcVar9 = (char *)malloc(0x100);
      ((kstring_t *)((long)input_file + 0x30))->s = pcVar9;
    }
    str = (kstring_t *)((long)input_file + 0x30);
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    bVar3 = iVar4 < iVar5;
    if (pkVar7->is_eof == 0 || bVar3) {
      do {
        puVar8 = pkVar7->buf;
        if (!bVar3) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) {
            pkVar7->is_eof = 1;
            break;
          }
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        bVar1 = puVar8[lVar12];
        uStackY_84 = (uint)bVar1;
        uVar13 = (uint)bVar1;
        if (uStackY_84 < 0x2b) {
          if (uVar13 != 10) goto LAB_00105386;
        }
        else {
          if (uVar13 == 0x2b) goto LAB_001053ef;
          if ((uVar13 == 0x3e) || (uVar13 == 0x40)) {
            *(uint *)&((kstring_t *)((long)input_file + 0x60))->l = uVar13;
            goto LAB_001053ef;
          }
LAB_00105386:
          sVar11 = ((kstring_t *)((long)input_file + 0x30))->l;
          ((kstring_t *)((long)input_file + 0x30))->l = sVar11 + 1;
          ((kstring_t *)((long)input_file + 0x30))->s[sVar11] = bVar1;
          ks_getuntil2(pkVar7,2,str,(int *)0x0,1);
          iVar4 = pkVar7->begin;
          iVar5 = pkVar7->end;
        }
        bVar3 = iVar4 < iVar5;
      } while ((pkVar7->is_eof == 0) || (iVar4 < iVar5));
    }
    uStackY_84 = 0xffffffff;
LAB_001053ef:
    sVar11 = ((kstring_t *)((long)input_file + 0x30))->l;
    pcVar9 = ((kstring_t *)((long)input_file + 0x30))->s;
    uVar10 = sVar11 + 1;
    if (((kstring_t *)((long)input_file + 0x30))->m <= uVar10) {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      __size = (uVar10 >> 0x10 | uVar10) + 1;
      ((kstring_t *)((long)input_file + 0x30))->m = __size;
      pcVar9 = (char *)realloc(pcVar9,__size);
      ((kstring_t *)((long)input_file + 0x30))->s = pcVar9;
      sVar11 = ((kstring_t *)((long)input_file + 0x30))->l;
    }
    pcVar9[sVar11] = '\0';
    if (uStackY_84 != 0x2b) {
      return (int)str->l;
    }
    uVar10 = ((kstring_t *)((long)input_file + 0x30))->m;
    if (((kstring_t *)((long)input_file + 0x48))->m < uVar10) {
      ((kstring_t *)((long)input_file + 0x48))->m = uVar10;
      pcVar9 = (char *)realloc(((kstring_t *)((long)input_file + 0x48))->s,uVar10);
      ((kstring_t *)((long)input_file + 0x48))->s = pcVar9;
    }
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    iVar14 = -2;
    do {
      if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
        return -2;
      }
      puVar8 = pkVar7->buf;
      if (iVar5 <= iVar4) {
        pkVar7->begin = 0;
        iVar5 = gzread(pkVar7->f,puVar8,0xffff);
        pkVar7->end = iVar5;
        if (iVar5 == 0) {
LAB_00105512:
          pkVar7->is_eof = 1;
          return iVar14;
        }
        iVar4 = pkVar7->begin;
        puVar8 = pkVar7->buf;
      }
      lVar12 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pkVar7->begin = iVar4;
      uStackY_84 = (uint)puVar8[lVar12];
    } while (uStackY_84 != 10);
    uStackY_84 = 10;
    do {
      iVar4 = ks_getuntil2(pkVar7,2,(kstring_t *)((long)input_file + 0x48),(int *)0x0,1);
      uVar10 = str->l;
      uVar2 = ((kstring_t *)((long)input_file + 0x48))->l;
      if (iVar4 < 0) break;
    } while (uVar2 < uVar10);
    *(undefined4 *)&((kstring_t *)((long)input_file + 0x60))->l = 0;
    if (uVar10 != uVar2) {
      return -2;
    }
    return (int)uVar10;
  }
  seq = (kseq_t *)calloc(1,0x70);
  pkVar7 = (kstream_t *)calloc(1,0x20);
  pkVar7->f = pgVar6;
  puVar8 = (uchar *)malloc(0xffff);
  pkVar7->buf = puVar8;
  seq->f = pkVar7;
  kseq_read(seq);
  pcVar9 = (seq->qual).s;
  gzrewind(pgVar6);
  pkVar7 = seq->f;
  pkVar7->begin = 0;
  pkVar7->end = 0;
  uVar13 = 0;
  pkVar7->is_eof = 0;
  seq->last_char = 0;
  if (verbose_flag != 0) {
    pull_by_size_cold_1();
  }
  iVar4 = kseq_read(seq);
  uVar15 = 0;
  if (-1 < iVar4) {
    uVar13 = 0;
    uVar15 = 0;
    do {
      iVar4 = size_filter(seq,(uint)(pcVar9 == (char *)0x0),min,max,length,convert,just_count);
      uVar15 = uVar15 + (iVar4 == 0);
      uVar13 = uVar13 + (iVar4 != 0);
      iVar4 = kseq_read(seq);
    } while (-1 < iVar4);
    if (seq == (kseq_t *)0x0) goto LAB_001051bc;
  }
  free((seq->name).s);
  free((seq->comment).s);
  free((seq->seq).s);
  free((seq->qual).s);
  pkVar7 = seq->f;
  if (pkVar7 != (kstream_t *)0x0) {
    free(pkVar7->buf);
    free(pkVar7);
  }
  free(seq);
LAB_001051bc:
  gzclose(pgVar6);
  if (just_count != 0) {
    fprintf(_stdout,"Total output: %i\n",(ulong)uVar13);
    fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar15);
  }
  return uVar13;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}